

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O0

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
winmd::reader::CustomAttribute::TypeNamespaceAndName
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,CustomAttribute *this)

{
  CustomAttributeType CVar1;
  MemberRefParent MVar2;
  coded_index<winmd::reader::CustomAttributeType> cVar3;
  MemberRef MVar4;
  coded_index<winmd::reader::MemberRefParent> cVar5;
  TypeDef TVar6;
  TypeRef TVar7;
  MethodDef MVar8;
  value_type vVar9;
  string_view local_1e8;
  string_view local_1d8;
  table_base *local_1c8;
  uint32_t local_1c0;
  table_base *local_1b8;
  uint32_t local_1b0;
  table_base *local_1a8;
  uint32_t local_1a0;
  typed_index<winmd::reader::CustomAttributeType> local_198;
  MethodDef local_188;
  TypeDef local_178;
  TypeDef *local_168;
  value_type *def_1;
  allocator<char> local_149;
  string local_148;
  string_view local_128;
  string_view local_118;
  table_base *local_108;
  uint32_t local_100;
  TypeRef local_f8;
  TypeRef *local_e8;
  TypeRef *ref;
  string_view local_d0;
  table_base *local_c0;
  uint32_t local_b8;
  TypeDef local_b0;
  TypeDef *local_a0;
  TypeDef *def;
  uint32_t local_90;
  table_base *local_88;
  uint32_t local_80;
  table_base *local_78;
  uint32_t local_70;
  typed_index<winmd::reader::CustomAttributeType> local_68;
  MemberRef local_58;
  index_base<winmd::reader::MemberRefParent> local_48;
  index_base<winmd::reader::MemberRefParent> *local_38;
  coded_index<winmd::reader::MemberRefParent> *member_parent;
  uint32_t local_28;
  index_base<winmd::reader::CustomAttributeType> local_20;
  CustomAttribute *local_10;
  CustomAttribute *this_local;
  
  local_10 = this;
  cVar3 = Type(this);
  member_parent =
       cVar3.super_typed_index<winmd::reader::CustomAttributeType>.
       super_index_base<winmd::reader::CustomAttributeType>.m_table;
  local_28 = cVar3.super_typed_index<winmd::reader::CustomAttributeType>.
             super_index_base<winmd::reader::CustomAttributeType>.m_value;
  local_20.m_table = (table_base *)member_parent;
  local_20.m_value = local_28;
  CVar1 = index_base<winmd::reader::CustomAttributeType>::type(&local_20);
  if (CVar1 == MemberRef) {
    cVar3 = Type(this);
    local_78 = cVar3.super_typed_index<winmd::reader::CustomAttributeType>.
               super_index_base<winmd::reader::CustomAttributeType>.m_table;
    local_70 = cVar3.super_typed_index<winmd::reader::CustomAttributeType>.
               super_index_base<winmd::reader::CustomAttributeType>.m_value;
    local_68.super_index_base<winmd::reader::CustomAttributeType>.m_table = local_78;
    local_68.super_index_base<winmd::reader::CustomAttributeType>.m_value = local_70;
    MVar4 = typed_index<winmd::reader::CustomAttributeType>::MemberRef(&local_68);
    local_88 = MVar4.super_row_base<winmd::reader::MemberRef>.m_table;
    local_80 = MVar4.super_row_base<winmd::reader::MemberRef>.m_index;
    local_58.super_row_base<winmd::reader::MemberRef>.m_table = local_88;
    local_58.super_row_base<winmd::reader::MemberRef>.m_index = local_80;
    cVar5 = MemberRef::Class(&local_58);
    def = cVar5.super_typed_index<winmd::reader::MemberRefParent>.
          super_index_base<winmd::reader::MemberRefParent>.m_table;
    local_90 = cVar5.super_typed_index<winmd::reader::MemberRefParent>.
               super_index_base<winmd::reader::MemberRefParent>.m_value;
    local_38 = &local_48;
    local_48.m_table = (table_base *)def;
    local_48.m_value = local_90;
    MVar2 = index_base<winmd::reader::MemberRefParent>::type(local_38);
    if (MVar2 == TypeDef) {
      TVar6 = typed_index<winmd::reader::MemberRefParent>::TypeDef
                        ((typed_index<winmd::reader::MemberRefParent> *)local_38);
      local_c0 = TVar6.super_row_base<winmd::reader::TypeDef>.m_table;
      local_b8 = TVar6.super_row_base<winmd::reader::TypeDef>.m_index;
      local_a0 = &local_b0;
      local_b0.super_row_base<winmd::reader::TypeDef>.m_table = local_c0;
      local_b0.super_row_base<winmd::reader::TypeDef>.m_index = local_b8;
      local_d0 = TypeDef::TypeNamespace(local_a0);
      _ref = TypeDef::TypeName(local_a0);
      cppwinrt::std::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
                (__return_storage_ptr__,&local_d0,
                 (basic_string_view<char,_std::char_traits<char>_> *)&ref);
    }
    else {
      if (MVar2 != TypeRef) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_148,
                   "A CustomAttribute MemberRef should only be a TypeDef or TypeRef",&local_149);
        impl::throw_invalid(&local_148);
      }
      TVar7 = typed_index<winmd::reader::MemberRefParent>::TypeRef
                        ((typed_index<winmd::reader::MemberRefParent> *)local_38);
      local_108 = TVar7.super_row_base<winmd::reader::TypeRef>.m_table;
      local_100 = TVar7.super_row_base<winmd::reader::TypeRef>.m_index;
      local_e8 = &local_f8;
      local_f8.super_row_base<winmd::reader::TypeRef>.m_table = local_108;
      local_f8.super_row_base<winmd::reader::TypeRef>.m_index = local_100;
      local_118 = TypeRef::TypeNamespace(local_e8);
      local_128 = TypeRef::TypeName(local_e8);
      cppwinrt::std::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
                (__return_storage_ptr__,&local_118,&local_128);
    }
  }
  else {
    cVar3 = Type(this);
    local_1a8 = cVar3.super_typed_index<winmd::reader::CustomAttributeType>.
                super_index_base<winmd::reader::CustomAttributeType>.m_table;
    local_1a0 = cVar3.super_typed_index<winmd::reader::CustomAttributeType>.
                super_index_base<winmd::reader::CustomAttributeType>.m_value;
    local_198.super_index_base<winmd::reader::CustomAttributeType>.m_table = local_1a8;
    local_198.super_index_base<winmd::reader::CustomAttributeType>.m_value = local_1a0;
    MVar8 = typed_index<winmd::reader::CustomAttributeType>::MethodDef(&local_198);
    local_1b8 = MVar8.super_row_base<winmd::reader::MethodDef>.m_table;
    local_1b0 = MVar8.super_row_base<winmd::reader::MethodDef>.m_index;
    local_188.super_row_base<winmd::reader::MethodDef>.m_table = local_1b8;
    local_188.super_row_base<winmd::reader::MethodDef>.m_index = local_1b0;
    vVar9 = MethodDef::Parent(&local_188);
    local_1c8 = vVar9.super_row_base<winmd::reader::TypeDef>.m_table;
    local_1c0 = vVar9.super_row_base<winmd::reader::TypeDef>.m_index;
    local_168 = &local_178;
    local_178.super_row_base<winmd::reader::TypeDef>.m_table = local_1c8;
    local_178.super_row_base<winmd::reader::TypeDef>.m_index = local_1c0;
    local_1d8 = TypeDef::TypeNamespace(local_168);
    local_1e8 = TypeDef::TypeName(local_168);
    cppwinrt::std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              (__return_storage_ptr__,&local_1d8,&local_1e8);
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto CustomAttribute::TypeNamespaceAndName() const
    {
        if (Type().type() == CustomAttributeType::MemberRef)
        {
            auto const& member_parent = Type().MemberRef().Class();
            switch (member_parent.type())
            {
            case MemberRefParent::TypeDef:
            {
                auto const& def = member_parent.TypeDef();
                return std::pair{ def.TypeNamespace(), def.TypeName() };
            }

            case MemberRefParent::TypeRef:
            {
                auto const& ref = member_parent.TypeRef();
                return std::pair{ ref.TypeNamespace(), ref.TypeName() };
            }
            default:
                impl::throw_invalid("A CustomAttribute MemberRef should only be a TypeDef or TypeRef");
            }
        }
        else
        {
            auto const& def = Type().MethodDef().Parent();
            return std::pair{ def.TypeNamespace(), def.TypeName() };
        }
    }